

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
Chainstate::InvalidateBlock(Chainstate *this,BlockValidationState *state,CBlockIndex *pindex)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  undefined2 uVar4;
  SynchronizationState SVar5;
  int iVar6;
  AnnotatedMixin<std::recursive_mutex> *pAVar7;
  type *ptVar8;
  Notifications *pNVar9;
  CBlockIndex *pCVar10;
  CBlockIndex *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CBlockIndex_*>,_bool> pVar11;
  type *block_index;
  type *_;
  BlockMap *__range1_1;
  bool ret;
  pair<const_uint256,_CBlockIndex> *entry;
  BlockMap *__range1;
  int disconnected;
  bool pindex_was_in_chain;
  iterator __end1_1;
  iterator __begin1_1;
  iterator candidate_it;
  DisconnectedBlockTransactions disconnectpool;
  CBlockIndex *invalid_walk_tip;
  CBlockIndex *candidate;
  iterator __end1;
  iterator __begin1;
  CBlockIndex *to_mark_failed;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock31;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock29;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock27;
  multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
  candidate_blocks_by_work;
  undefined2 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbfa;
  undefined1 in_stack_fffffffffffffbfb;
  int in_stack_fffffffffffffbfc;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  Chainstate *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  iterator in_stack_fffffffffffffc18;
  char *in_stack_fffffffffffffc20;
  char *func;
  DisconnectedBlockTransactions *in_stack_fffffffffffffc28;
  undefined6 in_stack_fffffffffffffc30;
  undefined2 in_stack_fffffffffffffc36;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined4 uVar12;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  type *in_stack_fffffffffffffc60;
  byte local_38b;
  undefined1 is_ibd;
  undefined4 in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  _Rb_tree_const_iterator<CBlockIndex_*> in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcdf;
  _Rb_tree_const_iterator<CBlockIndex_*> in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  _Rb_tree_const_iterator<CBlockIndex_*> in_stack_fffffffffffffd00;
  Chainstate *in_stack_fffffffffffffd08;
  Chainstate *in_stack_fffffffffffffd10;
  bool local_2a2;
  int local_264;
  byte local_211;
  ChainstateManager *in_stack_fffffffffffffe68;
  CBlockIndex *local_128;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
             in_stack_fffffffffffffbfc,(Mutex *)0x7dd38c);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
             in_stack_fffffffffffffbfc,(RecursiveMutex *)0x7dd3ab);
  if (in_RDX == (CBlockIndex *)0x0) {
    __assert_fail("pindex",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xe2d,"bool Chainstate::InvalidateBlock(BlockValidationState &, CBlockIndex *)");
  }
  if (in_RDX->nHeight == 0) {
    local_211 = 0;
  }
  else {
    bVar3 = false;
    MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffbfc,
                                        CONCAT13(in_stack_fffffffffffffbfb,
                                                 CONCAT12(in_stack_fffffffffffffbfa,
                                                          in_stack_fffffffffffffbf8))));
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               (AnnotatedMixin<std::mutex> *)
               CONCAT26(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30),
               (char *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
               (int)((ulong)in_stack_fffffffffffffc18._M_node >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffc18._M_node >> 0x18,0));
    std::
    multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
    ::multimap((multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
                *)CONCAT44(in_stack_fffffffffffffbfc,
                           CONCAT13(in_stack_fffffffffffffbfb,
                                    CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))))
    ;
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffffbfc,
                        CONCAT13(in_stack_fffffffffffffbfb,
                                 CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               (AnnotatedMixin<std::recursive_mutex> *)
               CONCAT26(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30),
               (char *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
               (int)((ulong)in_stack_fffffffffffffc18._M_node >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffc18._M_node >> 0x18,0));
    std::
    unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
    ::begin((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
             *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    std::
    unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
    ::end((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
           *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
    local_264 = in_stack_fffffffffffffca4;
    while (bVar2 = std::__detail::operator==
                             ((_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                              in_stack_fffffffffffffc08,
                              (_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                              CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::operator*
                ((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                 CONCAT44(in_stack_fffffffffffffbfc,
                          CONCAT13(in_stack_fffffffffffffbfb,
                                   CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))));
      bVar2 = CChain::Contains((CChain *)in_stack_fffffffffffffc08,
                               (CBlockIndex *)
                               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
      local_2a2 = false;
      if (!bVar2) {
        bVar2 = ::node::CBlockIndexWorkComparator::operator()
                          ((CBlockIndexWorkComparator *)
                           CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                           (CBlockIndex *)in_stack_fffffffffffffc08,
                           (CBlockIndex *)
                           CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
        local_2a2 = false;
        if (!bVar2) {
          bVar2 = CBlockIndex::IsValid
                            ((CBlockIndex *)
                             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                             (BlockStatus)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          local_2a2 = false;
          if (bVar2) {
            local_2a2 = CBlockIndex::HaveNumChainTxs
                                  ((CBlockIndex *)
                                   CONCAT44(in_stack_fffffffffffffbfc,
                                            CONCAT13(in_stack_fffffffffffffbfb,
                                                     CONCAT12(in_stack_fffffffffffffbfa,
                                                              in_stack_fffffffffffffbf8))));
          }
        }
      }
      if (local_2a2 != false) {
        std::make_pair<arith_uint256&,CBlockIndex*&>
                  ((arith_uint256 *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                   (CBlockIndex **)
                   CONCAT44(in_stack_fffffffffffffbfc,
                            CONCAT13(in_stack_fffffffffffffbfb,
                                     CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8)))
                  );
        std::
        multimap<arith_uint256_const,CBlockIndex*,std::less<arith_uint256_const>,std::allocator<std::pair<arith_uint256_const,CBlockIndex*>>>
        ::insert<std::pair<arith_uint256,CBlockIndex*>>
                  ((multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
                    *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                   (pair<arith_uint256,_CBlockIndex_*> *)
                   CONCAT44(in_stack_fffffffffffffbfc,
                            CONCAT13(in_stack_fffffffffffffbfb,
                                     CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8)))
                  );
      }
      std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::operator++
                ((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                 CONCAT44(in_stack_fffffffffffffbfc,
                          CONCAT13(in_stack_fffffffffffffbfb,
                                   CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))));
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,
                        CONCAT13(in_stack_fffffffffffffbfb,
                                 CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))));
    local_128 = in_RDX;
    do {
      bVar2 = util::SignalInterrupt::operator_cast_to_bool
                        ((SignalInterrupt *)
                         CONCAT44(in_stack_fffffffffffffbfc,
                                  CONCAT13(in_stack_fffffffffffffbfb,
                                           CONCAT12(in_stack_fffffffffffffbfa,
                                                    in_stack_fffffffffffffbf8))));
      if (bVar2) goto LAB_007ddd20;
      if (*(long *)(*(long *)(in_RDI + 0x50) + 0x7d8) != 0) {
        LimitValidationInterfaceQueue
                  ((ValidationSignals *)
                   CONCAT44(in_stack_fffffffffffffbfc,
                            CONCAT13(in_stack_fffffffffffffbfb,
                                     CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8)))
                  );
      }
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT44(in_stack_fffffffffffffbfc,
                          CONCAT13(in_stack_fffffffffffffbfb,
                                   CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                 (AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT26(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30),
                 (char *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                 (int)((ulong)in_stack_fffffffffffffc18._M_node >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffc18._M_node >> 0x18,0));
      MempoolMutex(in_stack_fffffffffffffc08);
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT44(in_stack_fffffffffffffbfc,
                          CONCAT13(in_stack_fffffffffffffbfb,
                                   CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                 (AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT26(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30),
                 (char *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                 (int)((ulong)in_stack_fffffffffffffc18._M_node >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffc18._M_node >> 0x18,0));
      bVar2 = CChain::Contains((CChain *)in_stack_fffffffffffffc08,
                               (CBlockIndex *)
                               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
      if (bVar2) {
        bVar3 = true;
        pCVar10 = CChain::Tip((CChain *)in_stack_fffffffffffffc08);
        DisconnectedBlockTransactions::DisconnectedBlockTransactions
                  (in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
        bVar2 = DisconnectTip(in_stack_fffffffffffffd10,
                              (BlockValidationState *)in_stack_fffffffffffffd08,
                              (DisconnectedBlockTransactions *)in_stack_fffffffffffffd00._M_node);
        MaybeUpdateMempoolForReorg
                  ((Chainstate *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                   (DisconnectedBlockTransactions *)in_stack_fffffffffffffce0._M_node,
                   (bool)in_stack_fffffffffffffcdf);
        if (bVar2) {
          in_stack_fffffffffffffd08 = (Chainstate *)pCVar10->pprev;
          in_stack_fffffffffffffd10 = (Chainstate *)CChain::Tip((CChain *)in_stack_fffffffffffffc08)
          ;
          if (in_stack_fffffffffffffd08 != in_stack_fffffffffffffd10) {
            __assert_fail("invalid_walk_tip->pprev == m_chain.Tip()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0xe6e,
                          "bool Chainstate::InvalidateBlock(BlockValidationState &, CBlockIndex *)")
            ;
          }
          pCVar10->nStatus = pCVar10->nStatus | 0x20;
          pVar11 = std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                   ::insert((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                             *)in_stack_fffffffffffffc08,
                            (value_type *)
                            CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
          in_stack_fffffffffffffd00 = pVar11.first._M_node;
          std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
          erase((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                 *)in_stack_fffffffffffffc08,
                (key_type *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
          pVar11 = std::
                   set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                   ::insert((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                             *)in_stack_fffffffffffffc08,
                            (value_type *)
                            CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
          in_stack_fffffffffffffcef = pVar11.second;
          if ((pCVar10->pprev == local_128) && ((local_128->nStatus & 0x20) != 0)) {
            local_128->nStatus = local_128->nStatus ^ 0x20 | 0x40;
            pVar11 = std::
                     set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::
                     insert((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                             *)in_stack_fffffffffffffc08,
                            (value_type *)
                            CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
            in_stack_fffffffffffffce0 = pVar11.first._M_node;
            in_stack_fffffffffffffcdf = pVar11.second;
          }
          std::
          multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
          ::lower_bound((multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
                         *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                        (key_type *)
                        CONCAT44(in_stack_fffffffffffffbfc,
                                 CONCAT13(in_stack_fffffffffffffbfb,
                                          CONCAT12(in_stack_fffffffffffffbfa,
                                                   in_stack_fffffffffffffbf8))));
          while( true ) {
            std::
            multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
            ::end((multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
                   *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
            bVar2 = std::operator==((_Self *)in_stack_fffffffffffffc08,
                                    (_Self *)CONCAT17(in_stack_fffffffffffffc07,
                                                      in_stack_fffffffffffffc00));
            if (((bVar2 ^ 0xffU) & 1) == 0) break;
            std::_Rb_tree_iterator<std::pair<const_arith_uint256,_CBlockIndex_*>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_arith_uint256,_CBlockIndex_*>_> *)
                       CONCAT44(in_stack_fffffffffffffbfc,
                                CONCAT13(in_stack_fffffffffffffbfb,
                                         CONCAT12(in_stack_fffffffffffffbfa,
                                                  in_stack_fffffffffffffbf8))));
            bVar2 = ::node::CBlockIndexWorkComparator::operator()
                              ((CBlockIndexWorkComparator *)
                               CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                               (CBlockIndex *)in_stack_fffffffffffffc08,
                               (CBlockIndex *)
                               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              std::_Rb_tree_iterator<std::pair<const_arith_uint256,_CBlockIndex_*>_>::operator++
                        ((_Rb_tree_iterator<std::pair<const_arith_uint256,_CBlockIndex_*>_> *)
                         CONCAT44(in_stack_fffffffffffffbfc,
                                  CONCAT13(in_stack_fffffffffffffbfb,
                                           CONCAT12(in_stack_fffffffffffffbfa,
                                                    in_stack_fffffffffffffbf8))));
            }
            else {
              std::_Rb_tree_iterator<std::pair<const_arith_uint256,_CBlockIndex_*>_>::operator->
                        ((_Rb_tree_iterator<std::pair<const_arith_uint256,_CBlockIndex_*>_> *)
                         CONCAT44(in_stack_fffffffffffffbfc,
                                  CONCAT13(in_stack_fffffffffffffbfb,
                                           CONCAT12(in_stack_fffffffffffffbfa,
                                                    in_stack_fffffffffffffbf8))));
              pVar11 = std::
                       set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                       ::insert((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                                 *)in_stack_fffffffffffffc08,
                                (value_type *)
                                CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
              in_stack_fffffffffffffcc0 = pVar11.first._M_node;
              in_stack_fffffffffffffcbf = pVar11.second;
              std::
              multimap<arith_uint256_const,CBlockIndex*,std::less<arith_uint256_const>,std::allocator<std::pair<arith_uint256_const,CBlockIndex*>>>
              ::erase_abi_cxx11_((multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                                 in_stack_fffffffffffffc18);
            }
          }
          local_264 = 0;
          local_128 = pCVar10;
        }
        else {
          local_211 = 0;
          local_264 = 1;
        }
        DisconnectedBlockTransactions::~DisconnectedBlockTransactions
                  ((DisconnectedBlockTransactions *)
                   CONCAT44(in_stack_fffffffffffffbfc,
                            CONCAT13(in_stack_fffffffffffffbfb,
                                     CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8)))
                  );
      }
      else {
        local_264 = 5;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffbfc,
                          CONCAT13(in_stack_fffffffffffffbfb,
                                   CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffbfc,
                          CONCAT13(in_stack_fffffffffffffbfb,
                                   CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))));
    } while (local_264 == 0);
    if (local_264 == 5) {
LAB_007ddd20:
      ChainstateManager::CheckBlockIndex(in_stack_fffffffffffffe68);
      pAVar7 = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                         ((AnnotatedMixin<std::recursive_mutex> *)
                          CONCAT44(in_stack_fffffffffffffbfc,
                                   CONCAT13(in_stack_fffffffffffffbfb,
                                            CONCAT12(in_stack_fffffffffffffbfa,
                                                     in_stack_fffffffffffffbf8))));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                 (AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT26(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30),
                 (char *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                 (int)((ulong)in_stack_fffffffffffffc18._M_node >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffc18._M_node >> 0x18,0));
      bVar2 = CChain::Contains((CChain *)in_stack_fffffffffffffc08,
                               (CBlockIndex *)
                               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
      is_ibd = (undefined1)((ulong)pAVar7 >> 0x38);
      if (bVar2) {
        local_211 = 0;
        bVar2 = true;
      }
      else {
        local_128->nStatus = local_128->nStatus | 0x20;
        std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::insert
                  ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
                   in_stack_fffffffffffffc08,
                   (value_type *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
        std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
        erase((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *
              )in_stack_fffffffffffffc08,
              (key_type *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
        std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::insert
                  ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
                   in_stack_fffffffffffffc08,
                   (value_type *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
        std::
        unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
        ::begin((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                 *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
        std::
        unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
        ::end((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
               *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
        while( true ) {
          bVar2 = std::__detail::operator==
                            ((_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                             in_stack_fffffffffffffc08,
                             (_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                             CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
          is_ibd = (undefined1)((ulong)pAVar7 >> 0x38);
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::
          operator*((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                    CONCAT44(in_stack_fffffffffffffbfc,
                             CONCAT13(in_stack_fffffffffffffbfb,
                                      CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))
                            ));
          std::get<0ul,uint256_const,CBlockIndex>
                    ((pair<const_uint256,_CBlockIndex> *)
                     CONCAT44(in_stack_fffffffffffffbfc,
                              CONCAT13(in_stack_fffffffffffffbfb,
                                       CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8)
                                      )));
          ptVar8 = std::get<1ul,uint256_const,CBlockIndex>
                             ((pair<const_uint256,_CBlockIndex> *)
                              CONCAT44(in_stack_fffffffffffffbfc,
                                       CONCAT13(in_stack_fffffffffffffbfb,
                                                CONCAT12(in_stack_fffffffffffffbfa,
                                                         in_stack_fffffffffffffbf8))));
          bVar2 = CBlockIndex::IsValid
                            ((CBlockIndex *)
                             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                             (BlockStatus)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          local_38b = 0;
          if (bVar2) {
            bVar2 = CBlockIndex::HaveNumChainTxs
                              ((CBlockIndex *)
                               CONCAT44(in_stack_fffffffffffffbfc,
                                        CONCAT13(in_stack_fffffffffffffbfb,
                                                 CONCAT12(in_stack_fffffffffffffbfa,
                                                          in_stack_fffffffffffffbf8))));
            local_38b = 0;
            if (bVar2) {
              std::
              set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
              value_comp((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                          *)CONCAT44(in_stack_fffffffffffffbfc,
                                     CONCAT13(in_stack_fffffffffffffbfb,
                                              CONCAT12(in_stack_fffffffffffffbfa,
                                                       in_stack_fffffffffffffbf8))));
              CChain::Tip((CChain *)in_stack_fffffffffffffc08);
              in_stack_fffffffffffffc5f =
                   ::node::CBlockIndexWorkComparator::operator()
                             ((CBlockIndexWorkComparator *)
                              CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                              (CBlockIndex *)in_stack_fffffffffffffc08,
                              (CBlockIndex *)
                              CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
              local_38b = in_stack_fffffffffffffc5f ^ 0xff;
              in_stack_fffffffffffffc60 = ptVar8;
            }
          }
          if ((local_38b & 1) != 0) {
            std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
            ::insert((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                      *)in_stack_fffffffffffffc08,
                     (value_type *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
          }
          std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::
          operator++((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                     CONCAT44(in_stack_fffffffffffffbfc,
                              CONCAT13(in_stack_fffffffffffffbfb,
                                       CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8)
                                      )));
        }
        InvalidChainFound((Chainstate *)in_stack_fffffffffffffcc0._M_node,
                          (CBlockIndex *)
                          CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
        bVar2 = false;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffffbfc,
                          CONCAT13(in_stack_fffffffffffffbfb,
                                   CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))));
      if (!bVar2) {
        if (bVar3) {
          pNVar9 = ChainstateManager::GetNotifications
                             ((ChainstateManager *)
                              CONCAT44(in_stack_fffffffffffffbfc,
                                       CONCAT13(in_stack_fffffffffffffbfb,
                                                CONCAT12(in_stack_fffffffffffffbfa,
                                                         in_stack_fffffffffffffbf8))));
          bVar3 = ChainstateManager::IsInitialBlockDownload
                            ((ChainstateManager *)CONCAT44(local_264,in_stack_fffffffffffffca0));
          uVar12 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffc3c);
          std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          SVar5 = GetSynchronizationState
                            ((bool)in_stack_fffffffffffffbfb,(bool)in_stack_fffffffffffffbfa);
          iVar6 = (*pNVar9->_vptr_Notifications[2])(pNVar9,(ulong)SVar5,local_128->pprev);
          uVar4 = (undefined2)iVar6;
          if (*(long *)(*(long *)(in_RDI + 0x50) + 0x7d8) != 0) {
            func = *(char **)(*(long *)(in_RDI + 0x50) + 0x7d8);
            pCVar10 = CChain::Tip((CChain *)in_stack_fffffffffffffc08);
            inline_assertion_check<true,CBlockIndex*>
                      ((CBlockIndex **)CONCAT44(uVar12,SVar5),
                       (char *)CONCAT26(uVar4,in_stack_fffffffffffffc30),
                       (int)((ulong)pCVar10 >> 0x20),func,(char *)in_stack_fffffffffffffc18._M_node)
            ;
            ChainstateManager::IsInitialBlockDownload
                      ((ChainstateManager *)CONCAT44(local_264,in_stack_fffffffffffffca0));
            ValidationSignals::ActiveTipChange
                      ((ValidationSignals *)in_stack_fffffffffffffc60,
                       (CBlockIndex *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                       (bool)is_ibd);
          }
        }
        local_211 = 1;
      }
    }
    std::
    multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
    ::~multimap((multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
                 *)CONCAT44(in_stack_fffffffffffffbfc,
                            CONCAT13(in_stack_fffffffffffffbfb,
                                     CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8)))
               );
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,
                        CONCAT13(in_stack_fffffffffffffbfb,
                                 CONCAT12(in_stack_fffffffffffffbfa,in_stack_fffffffffffffbf8))));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(local_211 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::InvalidateBlock(BlockValidationState& state, CBlockIndex* pindex)
{
    AssertLockNotHeld(m_chainstate_mutex);
    AssertLockNotHeld(::cs_main);

    // Genesis block can't be invalidated
    assert(pindex);
    if (pindex->nHeight == 0) return false;

    CBlockIndex* to_mark_failed = pindex;
    bool pindex_was_in_chain = false;
    int disconnected = 0;

    // We do not allow ActivateBestChain() to run while InvalidateBlock() is
    // running, as that could cause the tip to change while we disconnect
    // blocks.
    LOCK(m_chainstate_mutex);

    // We'll be acquiring and releasing cs_main below, to allow the validation
    // callbacks to run. However, we should keep the block index in a
    // consistent state as we disconnect blocks -- in particular we need to
    // add equal-work blocks to setBlockIndexCandidates as we disconnect.
    // To avoid walking the block index repeatedly in search of candidates,
    // build a map once so that we can look up candidate blocks by chain
    // work as we go.
    std::multimap<const arith_uint256, CBlockIndex *> candidate_blocks_by_work;

    {
        LOCK(cs_main);
        for (auto& entry : m_blockman.m_block_index) {
            CBlockIndex* candidate = &entry.second;
            // We don't need to put anything in our active chain into the
            // multimap, because those candidates will be found and considered
            // as we disconnect.
            // Instead, consider only non-active-chain blocks that have at
            // least as much work as where we expect the new tip to end up.
            if (!m_chain.Contains(candidate) &&
                    !CBlockIndexWorkComparator()(candidate, pindex->pprev) &&
                    candidate->IsValid(BLOCK_VALID_TRANSACTIONS) &&
                    candidate->HaveNumChainTxs()) {
                candidate_blocks_by_work.insert(std::make_pair(candidate->nChainWork, candidate));
            }
        }
    }

    // Disconnect (descendants of) pindex, and mark them invalid.
    while (true) {
        if (m_chainman.m_interrupt) break;

        // Make sure the queue of validation callbacks doesn't grow unboundedly.
        if (m_chainman.m_options.signals) LimitValidationInterfaceQueue(*m_chainman.m_options.signals);

        LOCK(cs_main);
        // Lock for as long as disconnectpool is in scope to make sure MaybeUpdateMempoolForReorg is
        // called after DisconnectTip without unlocking in between
        LOCK(MempoolMutex());
        if (!m_chain.Contains(pindex)) break;
        pindex_was_in_chain = true;
        CBlockIndex *invalid_walk_tip = m_chain.Tip();

        // ActivateBestChain considers blocks already in m_chain
        // unconditionally valid already, so force disconnect away from it.
        DisconnectedBlockTransactions disconnectpool{MAX_DISCONNECTED_TX_POOL_BYTES};
        bool ret = DisconnectTip(state, &disconnectpool);
        // DisconnectTip will add transactions to disconnectpool.
        // Adjust the mempool to be consistent with the new tip, adding
        // transactions back to the mempool if disconnecting was successful,
        // and we're not doing a very deep invalidation (in which case
        // keeping the mempool up to date is probably futile anyway).
        MaybeUpdateMempoolForReorg(disconnectpool, /* fAddToMempool = */ (++disconnected <= 10) && ret);
        if (!ret) return false;
        assert(invalid_walk_tip->pprev == m_chain.Tip());

        // We immediately mark the disconnected blocks as invalid.
        // This prevents a case where pruned nodes may fail to invalidateblock
        // and be left unable to start as they have no tip candidates (as there
        // are no blocks that meet the "have data and are not invalid per
        // nStatus" criteria for inclusion in setBlockIndexCandidates).
        invalid_walk_tip->nStatus |= BLOCK_FAILED_VALID;
        m_blockman.m_dirty_blockindex.insert(invalid_walk_tip);
        setBlockIndexCandidates.erase(invalid_walk_tip);
        setBlockIndexCandidates.insert(invalid_walk_tip->pprev);
        if (invalid_walk_tip->pprev == to_mark_failed && (to_mark_failed->nStatus & BLOCK_FAILED_VALID)) {
            // We only want to mark the last disconnected block as BLOCK_FAILED_VALID; its children
            // need to be BLOCK_FAILED_CHILD instead.
            to_mark_failed->nStatus = (to_mark_failed->nStatus ^ BLOCK_FAILED_VALID) | BLOCK_FAILED_CHILD;
            m_blockman.m_dirty_blockindex.insert(to_mark_failed);
        }

        // Add any equal or more work headers to setBlockIndexCandidates
        auto candidate_it = candidate_blocks_by_work.lower_bound(invalid_walk_tip->pprev->nChainWork);
        while (candidate_it != candidate_blocks_by_work.end()) {
            if (!CBlockIndexWorkComparator()(candidate_it->second, invalid_walk_tip->pprev)) {
                setBlockIndexCandidates.insert(candidate_it->second);
                candidate_it = candidate_blocks_by_work.erase(candidate_it);
            } else {
                ++candidate_it;
            }
        }

        // Track the last disconnected block, so we can correct its BLOCK_FAILED_CHILD status in future
        // iterations, or, if it's the last one, call InvalidChainFound on it.
        to_mark_failed = invalid_walk_tip;
    }

    m_chainman.CheckBlockIndex();

    {
        LOCK(cs_main);
        if (m_chain.Contains(to_mark_failed)) {
            // If the to-be-marked invalid block is in the active chain, something is interfering and we can't proceed.
            return false;
        }

        // Mark pindex (or the last disconnected block) as invalid, even when it never was in the main chain
        to_mark_failed->nStatus |= BLOCK_FAILED_VALID;
        m_blockman.m_dirty_blockindex.insert(to_mark_failed);
        setBlockIndexCandidates.erase(to_mark_failed);
        m_chainman.m_failed_blocks.insert(to_mark_failed);

        // If any new blocks somehow arrived while we were disconnecting
        // (above), then the pre-calculation of what should go into
        // setBlockIndexCandidates may have missed entries. This would
        // technically be an inconsistency in the block index, but if we clean
        // it up here, this should be an essentially unobservable error.
        // Loop back over all block index entries and add any missing entries
        // to setBlockIndexCandidates.
        for (auto& [_, block_index] : m_blockman.m_block_index) {
            if (block_index.IsValid(BLOCK_VALID_TRANSACTIONS) && block_index.HaveNumChainTxs() && !setBlockIndexCandidates.value_comp()(&block_index, m_chain.Tip())) {
                setBlockIndexCandidates.insert(&block_index);
            }
        }

        InvalidChainFound(to_mark_failed);
    }

    // Only notify about a new block tip if the active chain was modified.
    if (pindex_was_in_chain) {
        // Ignoring return value for now, this could be changed to bubble up
        // kernel::Interrupted value to the caller so the caller could
        // distinguish between completed and interrupted operations. It might
        // also make sense for the blockTip notification to have an enum
        // parameter indicating the source of the tip change so hooks can
        // distinguish user-initiated invalidateblock changes from other
        // changes.
        (void)m_chainman.GetNotifications().blockTip(GetSynchronizationState(m_chainman.IsInitialBlockDownload(), m_chainman.m_blockman.m_blockfiles_indexed), *to_mark_failed->pprev);

        // Fire ActiveTipChange now for the current chain tip to make sure clients are notified.
        // ActivateBestChain may call this as well, but not necessarily.
        if (m_chainman.m_options.signals) {
            m_chainman.m_options.signals->ActiveTipChange(*Assert(m_chain.Tip()), m_chainman.IsInitialBlockDownload());
        }
    }
    return true;
}